

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

string * __thiscall
helics::CommonCore::getFederateNameNoThrow_abi_cxx11_(CommonCore *this,GlobalFederateId federateID)

{
  int iVar1;
  FederateState *pFVar2;
  FederateState *pFVar3;
  LocalFederateId federateID_00;
  
  if (getFederateNameNoThrow[abi:cxx11](helics::GlobalFederateId)::filterString_abi_cxx11_ == '\0')
  {
    iVar1 = __cxa_guard_acquire(&getFederateNameNoThrow[abi:cxx11](helics::GlobalFederateId)::
                                 filterString_abi_cxx11_);
    if (iVar1 != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &getFederateNameNoThrow[abi:cxx11](helics::GlobalFederateId)::
                      filterString_abi_cxx11_,&(this->super_BrokerBase).identifier,"_filters");
      __cxa_atexit(std::__cxx11::string::~string,
                   &getFederateNameNoThrow[abi:cxx11](helics::GlobalFederateId)::
                    filterString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&getFederateNameNoThrow[abi:cxx11](helics::GlobalFederateId)::
                           filterString_abi_cxx11_);
    }
  }
  if (getFederateNameNoThrow[abi:cxx11](helics::GlobalFederateId)::translatorString_abi_cxx11_ ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&getFederateNameNoThrow[abi:cxx11](helics::GlobalFederateId)::
                                 translatorString_abi_cxx11_);
    if (iVar1 != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &getFederateNameNoThrow[abi:cxx11](helics::GlobalFederateId)::
                      translatorString_abi_cxx11_,&(this->super_BrokerBase).identifier,
                     "_translators");
      __cxa_atexit(std::__cxx11::string::~string,
                   &getFederateNameNoThrow[abi:cxx11](helics::GlobalFederateId)::
                    translatorString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&getFederateNameNoThrow[abi:cxx11](helics::GlobalFederateId)::
                           translatorString_abi_cxx11_);
    }
  }
  if ((this->filterFedID)._M_i.gid == federateID.gid) {
    pFVar3 = (FederateState *)
             &getFederateNameNoThrow[abi:cxx11](helics::GlobalFederateId)::filterString_abi_cxx11_;
  }
  else if ((this->translatorFedID)._M_i.gid == federateID.gid) {
    pFVar3 = (FederateState *)
             &getFederateNameNoThrow[abi:cxx11](helics::GlobalFederateId)::
              translatorString_abi_cxx11_;
  }
  else {
    federateID_00.fid = federateID.gid + -0x20000;
    if (federateID.gid < 0x20000) {
      federateID_00.fid = federateID.gid;
    }
    pFVar2 = getFederateAt(this,federateID_00);
    pFVar3 = (FederateState *)unknownString_abi_cxx11_;
    if (pFVar2 != (FederateState *)0x0) {
      pFVar3 = pFVar2;
    }
  }
  return &pFVar3->name;
}

Assistant:

const std::string& CommonCore::getFederateNameNoThrow(GlobalFederateId federateID) const noexcept
{
    static const std::string filterString = getIdentifier() + "_filters";
    static const std::string translatorString = getIdentifier() + "_translators";
    if (federateID == filterFedID) {
        return filterString;
    }
    if (federateID == translatorFedID) {
        return translatorString;
    }
    auto* fed = getFederateAt(LocalFederateId(federateID.localIndex()));
    return (fed == nullptr) ? unknownString : fed->getIdentifier();
}